

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O2

bool __thiscall
double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  undefined4 in_register_00000014;
  char *pcVar6;
  uint64_t uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint *puVar11;
  uint64_t unsafe_interval;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t uVar15;
  ulong unsafe_interval_00;
  long in_FS_OFFSET;
  DiyFp DVar16;
  DiyFp DVar17;
  DiyFp DVar18;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  int *in_stack_ffffffffffffff28;
  uint64_t in_stack_ffffffffffffff30;
  uint local_84;
  uint local_80;
  int mk;
  DiyFp local_78;
  DiyFp local_68;
  DiyFp local_58;
  undefined1 local_48 [16];
  long local_38;
  
  pcVar6 = (char *)CONCAT44(in_register_00000014,requested_digits);
  puVar11 = buffer._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = (uint)this;
  local_58.f_ = (uint64_t)v;
  if (uVar10 < 2) {
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    DVar16 = Double::AsNormalizedDiyFp((Double *)&local_58);
    local_48._0_8_ = DVar16.f_;
    iVar9 = DVar16.e_;
    local_48._8_4_ = iVar9;
    local_58.e_ = 0;
    local_58._12_4_ = 0xaaaaaaaa;
    local_58.f_ = 0;
    local_68.e_ = 0;
    local_68._12_4_ = 0xaaaaaaaa;
    local_68.f_ = 0;
    if (uVar10 == 0) {
      local_78.f_ = (uint64_t)v;
      Double::NormalizedBoundaries((Double *)&local_78,&local_58,&local_68);
    }
    else {
      local_78.f_ = CONCAT44(local_78.f_._4_4_,(float)v);
      Single::NormalizedBoundaries((Single *)&local_78,&local_58,&local_68);
    }
    local_78.e_ = 0;
    local_78._12_4_ = 0xaaaaaaaa;
    local_78.f_ = 0;
    local_84 = 0xaaaaaaaa;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar9,-0x60 - iVar9,&local_78,(int *)&local_84);
    DVar16 = DiyFp::Times((DiyFp *)local_48,&local_78);
    DVar17 = DiyFp::Times(&local_58,&local_78);
    DVar18 = DiyFp::Times(&local_68,&local_78);
    uVar3 = DVar18.f_ + 1;
    uVar13 = (DVar18.f_ - DVar17.f_) + 2;
    bVar5 = -(char)DVar16.e_;
    uVar15 = 1;
    uVar7 = 1L << (bVar5 & 0x3f);
    uVar14 = uVar3 >> (bVar5 & 0x3f);
    uVar12 = uVar7 - 1;
    unsafe_interval_00 = uVar12 & uVar3;
    mk = -0x55555556;
    local_80 = 0xaaaaaaaa;
    BiggestPowerTen((uint32_t)uVar14,DVar16.e_ + 0x40,(uint32_t *)&mk,(int *)&local_80);
    *puVar11 = 0;
    uVar8 = (int)local_80 >> 0x1f & local_80;
    buffer_00.length_ = 0;
    uVar10 = local_80;
    uVar2 = mk;
    while( true ) {
      if ((int)uVar10 < 1) break;
      uVar4 = uVar14 & 0xffffffff;
      uVar14 = uVar4 % (ulong)uVar2;
      pcVar6[(int)buffer_00.length_] = (char)(uVar4 / uVar2) + '0';
      buffer_01.length_ = *puVar11 + 1;
      *puVar11 = buffer_01.length_;
      unsafe_interval = (uVar14 << (bVar5 & 0x3f)) + unsafe_interval_00;
      if (unsafe_interval < uVar13) {
        buffer_01.start_ = pcVar6;
        buffer_01._12_4_ = 0;
        bVar1 = RoundWeed(buffer_01,(int)uVar3 - (int)DVar16.f_,uVar13,unsafe_interval,
                          (ulong)uVar2 << (bVar5 & 0x3f),1,in_stack_ffffffffffffff30);
        if (!bVar1) goto LAB_00396667;
        iVar9 = ~local_84 + uVar10;
        goto LAB_00396640;
      }
      uVar2 = uVar2 / 10;
      uVar10 = uVar10 - 1;
      buffer_00.length_ = buffer_01.length_;
    }
    do {
      uVar15 = uVar15 * 10;
      uVar13 = uVar13 * 10;
      pcVar6[(int)buffer_00.length_] = (char)(unsafe_interval_00 * 10 >> (bVar5 & 0x3f)) + '0';
      buffer_00.length_ = *puVar11 + 1;
      *puVar11 = buffer_00.length_;
      unsafe_interval_00 = unsafe_interval_00 * 10 & uVar12;
      uVar8 = uVar8 - 1;
    } while (uVar13 <= unsafe_interval_00);
    buffer_00.start_ = pcVar6;
    buffer_00._12_4_ = 0;
    bVar1 = RoundWeed(buffer_00,((int)uVar3 - (int)DVar16.f_) * (int)uVar15,uVar13,
                      unsafe_interval_00,uVar7,uVar15,in_stack_ffffffffffffff30);
    if (!bVar1) {
LAB_00396667:
      bVar1 = false;
      goto LAB_00396669;
    }
    iVar9 = uVar8 - local_84;
  }
  else {
    if (uVar10 != 2) {
      abort();
    }
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    DVar16 = Double::AsNormalizedDiyFp((Double *)&local_58);
    local_48._0_8_ = DVar16.f_;
    local_58.e_ = 0;
    local_58._12_4_ = 0xaaaaaaaa;
    local_58.f_ = 0;
    iVar9 = DVar16.e_;
    local_48._8_4_ = iVar9;
    mk = -0x55555556;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar9,-0x60 - iVar9,&local_58,&mk);
    DVar16 = DiyFp::Times((DiyFp *)local_48,&local_58);
    bVar5 = -(char)DVar16.e_;
    uVar15 = 1;
    uVar7 = 1L << (bVar5 & 0x3f);
    uVar3 = uVar7 - 1 & DVar16.f_;
    uVar12 = DVar16.f_ >> (bVar5 & 0x3f);
    local_68.f_ = CONCAT44(local_68.f_._4_4_,0xaaaaaaaa);
    local_78.f_ = CONCAT44(local_78.f_._4_4_,0xaaaaaaaa);
    BiggestPowerTen((uint32_t)uVar12,DVar16.e_ + 0x40,(uint32_t *)&local_68,(int *)&local_78);
    *puVar11 = 0;
    uVar14 = 0;
    uVar10 = (uint)local_68.f_;
    for (local_80 = (uint)local_78.f_; 0 < (int)local_80; local_80 = local_80 - 1) {
      uVar13 = uVar12 & 0xffffffff;
      uVar12 = uVar13 % (ulong)uVar10;
      pcVar6[(int)uVar14] = (char)(uVar13 / uVar10) + '0';
      uVar14 = (ulong)(*puVar11 + 1);
      *puVar11 = *puVar11 + 1;
      if (mode == FAST_DTOA_SHORTEST_SINGLE) {
        local_80 = local_80 - 1;
        goto LAB_0039660f;
      }
      uVar10 = uVar10 / 10;
      mode = mode - FAST_DTOA_SHORTEST_SINGLE;
    }
    if (mode == FAST_DTOA_SHORTEST) {
LAB_0039660f:
      iVar9 = (int)((uVar12 & 0xffffffff) << (bVar5 & 0x3f)) + (int)uVar3;
      uVar7 = (ulong)uVar10 << (bVar5 & 0x3f);
      uVar15 = 1;
    }
    else {
      for (; (0 < (int)mode && (uVar15 < uVar3)); uVar15 = uVar15 * 10) {
        pcVar6[(int)uVar14] = (char)(uVar3 * 10 >> (bVar5 & 0x3f)) + '0';
        uVar14 = (ulong)(*puVar11 + 1);
        *puVar11 = *puVar11 + 1;
        mode = mode - FAST_DTOA_SHORTEST_SINGLE;
        uVar3 = uVar3 * 10 & uVar7 - 1;
        local_80 = local_80 - 1;
      }
      if (mode != FAST_DTOA_SHORTEST) goto LAB_00396667;
      iVar9 = (int)uVar3;
    }
    buffer_02._8_8_ = uVar14;
    buffer_02.start_ = pcVar6;
    bVar1 = RoundWeedCounted(buffer_02,iVar9,uVar7,uVar15,(uint64_t)&local_80,
                             in_stack_ffffffffffffff28);
    if (!bVar1) goto LAB_00396667;
    iVar9 = local_80 - mk;
  }
LAB_00396640:
  *length = iVar9 + *puVar11;
  pcVar6[(int)*puVar11] = '\0';
  bVar1 = true;
LAB_00396669:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}